

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdiSubWindowPrivate::updateWindowTitle(QMdiSubWindowPrivate *this,bool isRequestFromChild)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  QWidget *pQVar5;
  byte in_SIL;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  QWidget *titleWidget;
  QMdiSubWindow *q;
  QString *in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  QWidget *in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff68;
  byte bVar6;
  undefined1 uVar7;
  byte bVar8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = &q_func(in_RDI)->super_QWidget;
  bVar3 = false;
  bVar2 = false;
  bVar6 = false;
  if ((in_SIL & 1) != 0) {
    QWidget::windowTitle(in_stack_ffffffffffffff58);
    bVar3 = true;
    bVar4 = QString::isEmpty((QString *)0x631e0f);
    bVar6 = false;
    if (!bVar4) {
      bVar4 = QString::isEmpty((QString *)0x631e2d);
      bVar6 = false;
      if (!bVar4) {
        in_stack_ffffffffffffff58 = (QWidget *)&in_RDI->lastChildWindowTitle;
        QWidget::windowTitle(in_stack_ffffffffffffff58);
        bVar2 = true;
        bVar6 = ::operator!=((QString *)
                             CONCAT17(in_stack_ffffffffffffff57,
                                      CONCAT16(in_stack_ffffffffffffff56,
                                               CONCAT15(in_stack_ffffffffffffff55,
                                                        in_stack_ffffffffffffff50))),
                             in_stack_ffffffffffffff48);
      }
    }
  }
  uVar7 = bVar6;
  if (bVar2) {
    QString::~QString((QString *)0x631e95);
  }
  if (bVar3) {
    QString::~QString((QString *)0x631eab);
  }
  if ((bVar6 & 1) == 0) {
    if ((in_SIL & 1) != 0) {
      pQVar5 = ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x631edb);
    }
    bVar8 = 0;
    bVar6 = true;
    if (pQVar5 != (QWidget *)0x0) {
      QWidget::windowTitle(in_stack_ffffffffffffff58);
      bVar8 = 1;
      bVar6 = QString::isEmpty((QString *)0x631f20);
    }
    if ((bVar8 & 1) != 0) {
      QString::~QString((QString *)0x631f3f);
    }
    if ((bVar6 & 1) == 0) {
      in_RDI->ignoreWindowTitleChange = true;
      QWidget::windowTitle(in_stack_ffffffffffffff58);
      QWidget::setWindowTitle
                (pQVar5,(QString *)CONCAT17(bVar8,CONCAT16(uVar7,in_stack_ffffffffffffff68)));
      QString::~QString((QString *)0x631f87);
      pQVar5 = QMdiSubWindow::maximizedButtonsWidget((QMdiSubWindow *)in_stack_ffffffffffffff58);
      if (pQVar5 != (QWidget *)0x0) {
        setNewWindowTitle(in_RDI);
      }
      in_RDI->ignoreWindowTitleChange = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMdiSubWindowPrivate::updateWindowTitle(bool isRequestFromChild)
{
    Q_Q(QMdiSubWindow);
    if (isRequestFromChild && !q->windowTitle().isEmpty() && !lastChildWindowTitle.isEmpty()
            && lastChildWindowTitle != q->windowTitle()) {
        return;
    }

    QWidget *titleWidget = nullptr;
    if (isRequestFromChild)
        titleWidget = baseWidget;
    else
        titleWidget = q;
    if (!titleWidget || titleWidget->windowTitle().isEmpty())
        return;

    ignoreWindowTitleChange = true;
    q->setWindowTitle(titleWidget->windowTitle());
    if (q->maximizedButtonsWidget())
        setNewWindowTitle();
    ignoreWindowTitleChange = false;
}